

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cc
# Opt level: O2

double __thiscall
FIX::double_conversion::StringToDoubleConverter::StringToIeee<unsigned_short_const*>
          (StringToDoubleConverter *this,unsigned_short *input,int length,bool read_as_double,
          int *processed_characters_count)

{
  unsigned_short *end;
  ushort uVar1;
  ushort uVar2;
  char *pcVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  unsigned_short *puVar7;
  uint exponent;
  undefined7 in_register_00000009;
  int iVar8;
  int iVar9;
  unsigned_short uVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  unsigned_short uVar16;
  uint uVar17;
  Double *this_00;
  int len;
  byte bVar18;
  unsigned_short *unaff_R14;
  bool bVar19;
  float fVar20;
  double dVar21;
  undefined8 extraout_XMM0_Qb;
  undefined8 uVar22;
  Vector<const_char> buffer_00;
  Vector<const_char> buffer_01;
  DiyFp diy_fp;
  unsigned_short *local_3b8;
  ulong local_3b0;
  unsigned_short *local_3a8;
  uint local_39c;
  int *local_398;
  bool result_is_junk;
  double local_388;
  undefined8 uStack_380;
  uint local_378;
  int local_374;
  char *start;
  Vector<const_char> local_368;
  Vector<const_char> local_358;
  char buffer [782];
  
  *processed_characters_count = 0;
  if (length == 0) {
LAB_0017ccc8:
    return this->empty_string_value_;
  }
  local_388 = (double)CONCAT44(local_388._4_4_,(int)CONCAT71(in_register_00000009,read_as_double));
  end = input + length;
  exponent = this->flags_;
  local_3b8 = input;
  if ((exponent & 0x18) != 0) {
    bVar4 = AdvanceToNonspace<unsigned_short_const*>(&local_3b8,end);
    if (!bVar4) {
      *processed_characters_count = (int)((ulong)((long)local_3b8 - (long)input) >> 1);
      goto LAB_0017ccc8;
    }
    unaff_R14 = end;
    if (local_3b8 != input && (char)((exponent & 8) >> 3) == '\0') goto LAB_0017d51f;
  }
  uVar1 = *local_3b8;
  if ((uVar1 == 0x2d) || (uVar1 == 0x2b)) {
    bVar19 = uVar1 == 0x2d;
    puVar7 = local_3b8 + 1;
    local_3a8 = input;
    buffer._0_8_ = puVar7;
    bVar4 = AdvanceToNonspace<unsigned_short_const*>((unsigned_short **)buffer,end);
    if ((!bVar4) ||
       (puVar7 != (unsigned_short *)buffer._0_8_ && (char)((exponent & 0x20) >> 5) == '\0'))
    goto LAB_0017d51f;
    local_3b8 = (unsigned_short *)buffer._0_8_;
    uVar1 = *(ushort *)buffer._0_8_;
    uVar5 = (uint)CONCAT71((int7)((ulong)unaff_R14 >> 8),bVar19);
    input = local_3a8;
  }
  else {
    uVar5 = 0;
  }
  pcVar3 = this->infinity_symbol_;
  bVar4 = SUB41(uVar5,0);
  if ((pcVar3 != (char *)0x0) && ((uint)uVar1 == (int)*pcVar3)) {
    bVar19 = ConsumeSubString<unsigned_short_const*>(&local_3b8,end,pcVar3);
    if (((bVar19) && (local_3b8 == end || (exponent & 0x14) != 0)) &&
       (((exponent & 4) != 0 ||
        (bVar19 = AdvanceToNonspace<unsigned_short_const*>(&local_3b8,end), !bVar19)))) {
      *processed_characters_count = (int)((ulong)((long)local_3b8 - (long)input) >> 1);
      if (bVar4 != false) {
        return -INFINITY;
      }
      return INFINITY;
    }
LAB_0017cdc7:
    return this->junk_string_value_;
  }
  pcVar3 = this->nan_symbol_;
  if ((pcVar3 != (char *)0x0) && ((uint)uVar1 == (int)*pcVar3)) {
    bVar19 = ConsumeSubString<unsigned_short_const*>(&local_3b8,end,pcVar3);
    if (((bVar19) && (local_3b8 == end || (exponent & 0x14) != 0)) &&
       (((exponent & 4) != 0 ||
        (bVar19 = AdvanceToNonspace<unsigned_short_const*>(&local_3b8,end), !bVar19)))) {
      *processed_characters_count = (int)((ulong)((long)local_3b8 - (long)input) >> 1);
      if (bVar4 != false) {
        return -NAN;
      }
      return NAN;
    }
    goto LAB_0017cdc7;
  }
  iVar8 = 0;
  if (uVar1 != 0x30) {
    uVar5 = 0;
    puVar7 = local_3b8;
LAB_0017cdea:
    iVar14 = 0;
    uVar12 = 0;
    len = 0;
    do {
      uVar2 = *puVar7;
      uVar13 = (uint)uVar2;
      if (9 < (ushort)(uVar13 - 0x30)) {
        uVar17 = uVar5;
        if (iVar8 == 0) {
          uVar17 = 0;
        }
        local_3b0 = 0;
        if (uVar2 != 0x2e) goto LAB_0017d20f;
        if ((((byte)(exponent >> 2) & 0x3f | ~(byte)uVar17) & 1) == 0) goto LAB_0017d51f;
        local_3b8 = puVar7;
        if ((uVar17 & 1) == 0) {
          local_3b8 = puVar7 + 1;
          if (local_3b8 != end) {
            local_3b0 = 0;
            puVar7 = local_3b8;
            if (iVar8 != 0) goto LAB_0017d0d3;
            local_3b0 = 0;
            goto LAB_0017d2a2;
          }
          uVar17 = uVar5;
          if (iVar8 == 0) {
            local_398 = processed_characters_count;
            if (uVar1 == 0x30) goto LAB_0017cfd3;
            goto LAB_0017d51f;
          }
        }
        uVar6 = 0;
        puVar7 = local_3b8;
        local_398 = processed_characters_count;
        goto LAB_0017ce6a;
      }
      if (iVar8 < 0x304) {
        if (0x30d < len) {
          local_398 = processed_characters_count;
          __assert_fail("buffer_pos < kBufferSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                        ,0x319,
                        "double FIX::double_conversion::StringToDoubleConverter::StringToIeee(Iterator, int, bool, int *) const [Iterator = const unsigned short *]"
                       );
        }
        lVar11 = (long)len;
        len = len + 1;
        buffer[lVar11] = (char)uVar2;
        iVar8 = iVar8 + 1;
      }
      else {
        iVar14 = iVar14 + 1;
        uVar12 = CONCAT31((int3)(uVar13 - 0x30 >> 8),uVar2 != 0x30 | (byte)uVar12);
      }
      if ((uVar5 & 1) == 0) {
        uVar5 = 0;
      }
      else {
        uVar5 = (uint)(*puVar7 < 0x38);
      }
      puVar7 = puVar7 + 1;
    } while (puVar7 != end);
    uVar6 = 0;
    local_398 = processed_characters_count;
    uVar17 = uVar5;
    goto LAB_0017ce6a;
  }
  puVar7 = local_3b8 + 1;
  if (puVar7 == end) {
LAB_0017cf66:
    *processed_characters_count = length;
LAB_0017cf6d:
    if (bVar4 == false) {
      return 0.0;
    }
    return -0.0;
  }
  if (((exponent & 1) == 0) || ((*puVar7 | 0x20) != 0x78)) {
    do {
      if (*puVar7 != 0x30) {
        uVar5 = exponent >> 1 & 0x7f;
        goto LAB_0017cdea;
      }
      puVar7 = puVar7 + 1;
    } while (puVar7 != end);
    goto LAB_0017cf66;
  }
  puVar7 = local_3b8 + 2;
  if ((puVar7 == end) || (local_3a8 = end, bVar19 = isDigit((uint)*puVar7,0x10), !bVar19))
  goto LAB_0017d51f;
  dVar21 = this->junk_string_value_;
  uVar22 = 0;
  do {
    if (*puVar7 != 0x30) {
      local_3b0 = 0x18;
      if (local_388._0_1_ != '\0') {
        local_3b0 = 0x35;
      }
      this_00 = (Double *)0x0;
      uStack_380 = 0;
      iVar8 = 1;
      goto LAB_0017d19c;
    }
    puVar7 = puVar7 + 1;
  } while (puVar7 != local_3a8);
  local_3b8 = puVar7;
  if (bVar4 == false) {
    uVar22 = 0;
    local_388 = 0.0;
    goto LAB_0017d46d;
  }
  goto LAB_0017d465;
LAB_0017d19c:
  uVar1 = *puVar7;
  uVar12 = uVar1 - 0x30;
  local_388 = dVar21;
  local_39c = uVar5;
  if (9 < uVar12) {
    if ((ushort)(uVar1 - 0x61) < 6) {
      uVar12 = uVar1 - 0x57;
    }
    else {
      if (5 < (ushort)(uVar1 - 0x41)) {
        uVar5 = 0;
        uVar22 = 0;
        local_3b8 = puVar7;
        local_398 = processed_characters_count;
        if (((exponent & 4) == 0) &&
           (bVar4 = AdvanceToNonspace<unsigned_short_const*>(&local_3b8,local_3a8),
           uVar22 = uStack_380, bVar4)) {
          return local_388;
        }
        goto LAB_0017d3f8;
      }
      uVar12 = uVar1 - 0x37;
    }
  }
  this_00 = (Double *)((ulong)uVar12 + (long)this_00 * 0x10);
  uVar6 = (long)this_00 >> (sbyte)local_3b0;
  puVar7 = puVar7 + 1;
  if ((int)uVar6 == 0) goto code_r0x0017d1e8;
  local_374 = 0;
  for (; 1 < (int)(uint)uVar6; uVar6 = (ulong)((uint)uVar6 >> 1)) {
    iVar8 = iVar8 + 1;
    local_374 = local_374 + 1;
  }
  uVar6 = (long)this_00 >> ((byte)iVar8 & 0x3f);
  local_378 = (uint)this_00 & ~(-1 << ((byte)iVar8 & 0x1f));
  iVar8 = -iVar8;
  bVar18 = 1;
  local_398 = processed_characters_count;
  for (; puVar7 != local_3a8; puVar7 = puVar7 + 1) {
    uVar1 = *puVar7;
    bVar4 = isDigit((uint)uVar1,0x10);
    uVar22 = extraout_XMM0_Qb;
    if (!bVar4) break;
    bVar18 = bVar18 & uVar1 == 0x30;
    iVar8 = iVar8 + -4;
  }
  local_3b8 = puVar7;
  if (((exponent & 4) == 0) &&
     (bVar4 = AdvanceToNonspace<unsigned_short_const*>(&local_3b8,local_3a8), uVar22 = uStack_380,
     bVar4)) {
    return local_388;
  }
  uVar5 = 1 << ((byte)local_374 & 0x1f);
  if ((int)uVar5 < (int)local_378) {
    uVar6 = uVar6 + 1;
  }
  else if (local_378 == uVar5) {
    uVar6 = uVar6 + ((byte)(~bVar18 | (byte)uVar6) & 1);
  }
  bVar4 = (uVar6 >> (local_3b0 & 0x3f) & 1) != 0;
  uVar5 = (uint)bVar4 - iVar8;
  this_00 = (Double *)((long)uVar6 >> bVar4);
  goto LAB_0017d3f8;
code_r0x0017d1e8:
  if (puVar7 == local_3a8) goto code_r0x0017d1ed;
  goto LAB_0017d19c;
LAB_0017d2a2:
  if (*puVar7 != 0x30) goto LAB_0017d0d3;
  puVar7 = puVar7 + 1;
  if (puVar7 == end) {
    *processed_characters_count = length;
    goto LAB_0017cf6d;
  }
  local_3b0 = (ulong)((int)local_3b0 - 1);
  goto LAB_0017d2a2;
  while( true ) {
    if (iVar8 < 0x304) {
      if (0x30d < len) {
        local_398 = processed_characters_count;
        __assert_fail("buffer_pos < kBufferSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                      ,0x349,
                      "double FIX::double_conversion::StringToDoubleConverter::StringToIeee(Iterator, int, bool, int *) const [Iterator = const unsigned short *]"
                     );
      }
      lVar11 = (long)len;
      len = len + 1;
      buffer[lVar11] = (char)uVar2;
      iVar8 = iVar8 + 1;
      local_3b0 = (ulong)((int)local_3b0 - 1);
    }
    else {
      uVar12 = CONCAT31((int3)(uVar13 - 0x30 >> 8),uVar2 != 0x30 | (byte)uVar12);
    }
    puVar7 = puVar7 + 1;
    uVar6 = local_3b0;
    local_398 = processed_characters_count;
    if (puVar7 == end) break;
LAB_0017d0d3:
    uVar2 = *puVar7;
    uVar13 = (uint)uVar2;
    if (9 < (ushort)(uVar13 - 0x30)) goto LAB_0017d20f;
  }
  goto LAB_0017ce6a;
LAB_0017d20f:
  iVar15 = (int)local_3b0;
  if (((uVar1 != 0x30) && (iVar15 == 0)) && (iVar8 == 0)) goto LAB_0017d51f;
  uVar6 = local_3b0;
  local_3b8 = puVar7;
  if ((uVar13 | 0x20) == 0x65) {
    if (((~(byte)uVar17 | (byte)(exponent >> 2) & 0x3f) & 1) == 0) goto LAB_0017d51f;
    local_398 = processed_characters_count;
    if ((uVar17 & 1) != 0) goto LAB_0017ce6a;
    local_3b8 = puVar7 + 1;
    if (local_3b8 != end) {
      uVar16 = *local_3b8;
      if ((uVar16 == 0x2d) || (uVar16 == 0x2b)) {
        local_3b8 = puVar7 + 2;
        if (local_3b8 == end) goto joined_r0x0017d3c4;
      }
      else {
        uVar16 = 0x2b;
      }
      if ((local_3b8 != end) && (uVar10 = *local_3b8, 0xfff5 < (ushort)(uVar10 - 0x3a))) {
        if (0x3ffffffe < iVar15 + 0x1fffffffU) {
          __assert_fail("-max_exponent / 2 <= exponent && exponent <= max_exponent / 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                        ,0x380,
                        "double FIX::double_conversion::StringToDoubleConverter::StringToIeee(Iterator, int, bool, int *) const [Iterator = const unsigned short *]"
                       );
        }
        iVar8 = 0;
        do {
          local_3b8 = local_3b8 + 1;
          if ((iVar8 < 0x6666666) || ((iVar9 = 0x3fffffff, iVar8 == 0x6666666 && (uVar10 < 0x34))))
          {
            iVar9 = iVar8 * 10 + (uint)uVar10 + -0x30;
          }
          iVar8 = iVar9;
        } while ((local_3b8 != end) && (uVar10 = *local_3b8, (ushort)(uVar10 - 0x30) < 10));
        iVar9 = -iVar8;
        if ((char)uVar16 != '-') {
          iVar9 = iVar8;
        }
        uVar6 = (ulong)(uint)(iVar9 + iVar15);
        goto LAB_0017d515;
      }
    }
joined_r0x0017d3c4:
    puVar7 = local_3b8;
    if ((exponent & 4) == 0) {
LAB_0017d51f:
      return this->junk_string_value_;
    }
  }
  else {
LAB_0017d515:
    if ((((exponent & 0x14) == 0) && (local_3b8 != end)) ||
       ((local_398 = processed_characters_count, (exponent & 4) == 0 &&
        (local_3b0 = uVar6, local_3a8 = input, local_39c = uVar12,
        bVar19 = AdvanceToNonspace<unsigned_short_const*>(&local_3b8,end), input = local_3a8,
        uVar6 = local_3b0, uVar12 = local_39c, bVar19)))) goto LAB_0017d51f;
    puVar7 = local_3b8;
    if ((exponent & 0x10) != 0) {
      local_3a8 = input;
      local_39c = uVar12;
      AdvanceToNonspace<unsigned_short_const*>(&local_3b8,end);
      input = local_3a8;
      uVar12 = local_39c;
      puVar7 = local_3b8;
    }
  }
LAB_0017ce6a:
  local_3b8 = puVar7;
  if ((uVar17 & 1) == 0) {
    iVar14 = (int)uVar6 + iVar14;
LAB_0017cfd3:
    if ((uVar12 & 1) != 0) {
      lVar11 = (long)len;
      len = len + 1;
      buffer[lVar11] = '1';
      iVar14 = iVar14 + -1;
    }
    if (0x30d < len) {
      __assert_fail("buffer_pos < kBufferSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                    ,0x3b3,
                    "double FIX::double_conversion::StringToDoubleConverter::StringToIeee(Iterator, int, bool, int *) const [Iterator = const unsigned short *]"
                   );
    }
    buffer[len] = '\0';
    if (local_388._0_1_ == '\0') {
      Vector<const_char>::Vector(&local_368,buffer,len);
      buffer_01.start_ = (ulong)(uint)local_368.length_;
      buffer_01.length_ = iVar14;
      buffer_01._12_4_ = 0;
      fVar20 = Strtof((double_conversion *)local_368.start_,buffer_01,exponent);
      dVar21 = (double)fVar20;
    }
    else {
      Vector<const_char>::Vector(&local_358,buffer,len);
      buffer_00.start_ = (ulong)(uint)local_358.length_;
      buffer_00.length_ = iVar14;
      buffer_00._12_4_ = 0;
      dVar21 = Strtod((double_conversion *)local_358.start_,buffer_00,exponent);
    }
    *local_398 = (int)((ulong)((long)local_3b8 - (long)input) >> 1);
    if (bVar4 != false) {
      dVar21 = -dVar21;
    }
  }
  else {
    start = buffer;
    dVar21 = RadixStringToIeee<3,char*>
                       (&start,buffer + len,bVar4,SUB41((exponent & 4) >> 2,0),
                        this->junk_string_value_,(bool)local_388._0_1_,&result_is_junk);
    if (result_is_junk == true) {
      __assert_fail("!result_is_junk",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                    ,0x3a9,
                    "double FIX::double_conversion::StringToDoubleConverter::StringToIeee(Iterator, int, bool, int *) const [Iterator = const unsigned short *]"
                   );
    }
    *local_398 = (int)((ulong)((long)local_3b8 - (long)input) >> 1);
  }
  return dVar21;
code_r0x0017d1ed:
  uVar5 = 0;
  uVar22 = 0;
  local_3b8 = puVar7;
  local_398 = processed_characters_count;
LAB_0017d3f8:
  if (1L << ((byte)local_3b0 & 0x3f) <= (long)this_00) {
    __assert_fail("number < ((int64_t)1 << kSignificandSize)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                  ,0x273,
                  "double FIX::double_conversion::RadixStringToIeee(Iterator *, Iterator, bool, bool, double, bool, bool *) [radix_log_2 = 4, Iterator = const unsigned short *]"
                 );
  }
  if (this_00 != (Double *)(long)(double)(long)this_00) {
    __assert_fail("static_cast<int64_t>(static_cast<double>(number)) == number",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                  ,0x274,
                  "double FIX::double_conversion::RadixStringToIeee(Iterator *, Iterator, bool, bool, double, bool, bool *) [radix_log_2 = 4, Iterator = const unsigned short *]"
                 );
  }
  if (uVar5 != 0) {
    if (this_00 == (Double *)0x0) {
      __assert_fail("number != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                    ,0x280,
                    "double FIX::double_conversion::RadixStringToIeee(Iterator *, Iterator, bool, bool, double, bool, bool *) [radix_log_2 = 4, Iterator = const unsigned short *]"
                   );
    }
    diy_fp.f_ = (ulong)uVar5;
    diy_fp.e_ = exponent;
    diy_fp._12_4_ = 0;
    local_388 = (double)Double::DiyFpToUint64(this_00,diy_fp);
    uVar22 = 0;
    processed_characters_count = local_398;
    goto LAB_0017d46d;
  }
  processed_characters_count = local_398;
  local_388 = (double)(long)this_00;
  if ((char)local_39c == '\0') goto LAB_0017d46d;
  if (this_00 != (Double *)0x0) {
    local_388 = (double)-(long)this_00;
    goto LAB_0017d46d;
  }
LAB_0017d465:
  uVar22 = 0;
  local_388 = -0.0;
LAB_0017d46d:
  if ((exponent & 0x10) != 0) {
    uStack_380 = uVar22;
    AdvanceToNonspace<unsigned_short_const*>(&local_3b8,local_3a8);
  }
  *processed_characters_count = (int)((ulong)((long)local_3b8 - (long)input) >> 1);
  return local_388;
}

Assistant:

double StringToDoubleConverter::StringToIeee(
    Iterator input,
    int length,
    bool read_as_double,
    int* processed_characters_count) const {
  Iterator current = input;
  Iterator end = input + length;

  *processed_characters_count = 0;

  const bool allow_trailing_junk = (flags_ & ALLOW_TRAILING_JUNK) != 0;
  const bool allow_leading_spaces = (flags_ & ALLOW_LEADING_SPACES) != 0;
  const bool allow_trailing_spaces = (flags_ & ALLOW_TRAILING_SPACES) != 0;
  const bool allow_spaces_after_sign = (flags_ & ALLOW_SPACES_AFTER_SIGN) != 0;

  // To make sure that iterator dereferencing is valid the following
  // convention is used:
  // 1. Each '++current' statement is followed by check for equality to 'end'.
  // 2. If AdvanceToNonspace returned false then current == end.
  // 3. If 'current' becomes equal to 'end' the function returns or goes to
  // 'parsing_done'.
  // 4. 'current' is not dereferenced after the 'parsing_done' label.
  // 5. Code before 'parsing_done' may rely on 'current != end'.
  if (current == end) return empty_string_value_;

  if (allow_leading_spaces || allow_trailing_spaces) {
    if (!AdvanceToNonspace(&current, end)) {
      *processed_characters_count = static_cast<int>(current - input);
      return empty_string_value_;
    }
    if (!allow_leading_spaces && (input != current)) {
      // No leading spaces allowed, but AdvanceToNonspace moved forward.
      return junk_string_value_;
    }
  }

  // The longest form of simplified number is: "-<significant digits>.1eXXX\0".
  const int kBufferSize = kMaxSignificantDigits + 10;
  char buffer[kBufferSize];  // NOLINT: size is known at compile time.
  int buffer_pos = 0;

  // Exponent will be adjusted if insignificant digits of the integer part
  // or insignificant leading zeros of the fractional part are dropped.
  int exponent = 0;
  int significant_digits = 0;
  int insignificant_digits = 0;
  bool nonzero_digit_dropped = false;

  bool sign = false;

  if (*current == '+' || *current == '-') {
    sign = (*current == '-');
    ++current;
    Iterator next_non_space = current;
    // Skip following spaces (if allowed).
    if (!AdvanceToNonspace(&next_non_space, end)) return junk_string_value_;
    if (!allow_spaces_after_sign && (current != next_non_space)) {
      return junk_string_value_;
    }
    current = next_non_space;
  }

  if (infinity_symbol_ != NULL) {
    if (*current == infinity_symbol_[0]) {
      if (!ConsumeSubString(&current, end, infinity_symbol_)) {
        return junk_string_value_;
      }

      if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
        return junk_string_value_;
      }
      if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
        return junk_string_value_;
      }

      ASSERT(buffer_pos == 0);
      *processed_characters_count = static_cast<int>(current - input);
      return sign ? -Double::Infinity() : Double::Infinity();
    }
  }

  if (nan_symbol_ != NULL) {
    if (*current == nan_symbol_[0]) {
      if (!ConsumeSubString(&current, end, nan_symbol_)) {
        return junk_string_value_;
      }

      if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
        return junk_string_value_;
      }
      if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
        return junk_string_value_;
      }

      ASSERT(buffer_pos == 0);
      *processed_characters_count = static_cast<int>(current - input);
      return sign ? -Double::NaN() : Double::NaN();
    }
  }

  bool leading_zero = false;
  if (*current == '0') {
    ++current;
    if (current == end) {
      *processed_characters_count = static_cast<int>(current - input);
      return SignedZero(sign);
    }

    leading_zero = true;

    // It could be hexadecimal value.
    if ((flags_ & ALLOW_HEX) && (*current == 'x' || *current == 'X')) {
      ++current;
      if (current == end || !isDigit(*current, 16)) {
        return junk_string_value_;  // "0x".
      }

      bool result_is_junk;
      double result = RadixStringToIeee<4>(&current,
                                           end,
                                           sign,
                                           allow_trailing_junk,
                                           junk_string_value_,
                                           read_as_double,
                                           &result_is_junk);
      if (!result_is_junk) {
        if (allow_trailing_spaces) AdvanceToNonspace(&current, end);
        *processed_characters_count = static_cast<int>(current - input);
      }
      return result;
    }

    // Ignore leading zeros in the integer part.
    while (*current == '0') {
      ++current;
      if (current == end) {
        *processed_characters_count = static_cast<int>(current - input);
        return SignedZero(sign);
      }
    }
  }

  bool octal = leading_zero && (flags_ & ALLOW_OCTALS) != 0;

  // Copy significant digits of the integer part (if any) to the buffer.
  while (*current >= '0' && *current <= '9') {
    if (significant_digits < kMaxSignificantDigits) {
      ASSERT(buffer_pos < kBufferSize);
      buffer[buffer_pos++] = static_cast<char>(*current);
      significant_digits++;
      // Will later check if it's an octal in the buffer.
    } else {
      insignificant_digits++;  // Move the digit into the exponential part.
      nonzero_digit_dropped = nonzero_digit_dropped || *current != '0';
    }
    octal = octal && *current < '8';
    ++current;
    if (current == end) goto parsing_done;
  }

  if (significant_digits == 0) {
    octal = false;
  }

  if (*current == '.') {
    if (octal && !allow_trailing_junk) return junk_string_value_;
    if (octal) goto parsing_done;

    ++current;
    if (current == end) {
      if (significant_digits == 0 && !leading_zero) {
        return junk_string_value_;
      } else {
        goto parsing_done;
      }
    }

    if (significant_digits == 0) {
      // octal = false;
      // Integer part consists of 0 or is absent. Significant digits start after
      // leading zeros (if any).
      while (*current == '0') {
        ++current;
        if (current == end) {
          *processed_characters_count = static_cast<int>(current - input);
          return SignedZero(sign);
        }
        exponent--;  // Move this 0 into the exponent.
      }
    }

    // There is a fractional part.
    // We don't emit a '.', but adjust the exponent instead.
    while (*current >= '0' && *current <= '9') {
      if (significant_digits < kMaxSignificantDigits) {
        ASSERT(buffer_pos < kBufferSize);
        buffer[buffer_pos++] = static_cast<char>(*current);
        significant_digits++;
        exponent--;
      } else {
        // Ignore insignificant digits in the fractional part.
        nonzero_digit_dropped = nonzero_digit_dropped || *current != '0';
      }
      ++current;
      if (current == end) goto parsing_done;
    }
  }

  if (!leading_zero && exponent == 0 && significant_digits == 0) {
    // If leading_zeros is true then the string contains zeros.
    // If exponent < 0 then string was [+-]\.0*...
    // If significant_digits != 0 the string is not equal to 0.
    // Otherwise there are no digits in the string.
    return junk_string_value_;
  }

  // Parse exponential part.
  if (*current == 'e' || *current == 'E') {
    if (octal && !allow_trailing_junk) return junk_string_value_;
    if (octal) goto parsing_done;
    ++current;
    if (current == end) {
      if (allow_trailing_junk) {
        goto parsing_done;
      } else {
        return junk_string_value_;
      }
    }
    char exponen_sign = '+';
    if (*current == '+' || *current == '-') {
      exponen_sign = static_cast<char>(*current);
      ++current;
      if (current == end) {
        if (allow_trailing_junk) {
          goto parsing_done;
        } else {
          return junk_string_value_;
        }
      }
    }

    if (current == end || *current < '0' || *current > '9') {
      if (allow_trailing_junk) {
        goto parsing_done;
      } else {
        return junk_string_value_;
      }
    }

    const int max_exponent = INT_MAX / 2;
    ASSERT(-max_exponent / 2 <= exponent && exponent <= max_exponent / 2);
    int num = 0;
    do {
      // Check overflow.
      int digit = *current - '0';
      if (num >= max_exponent / 10
          && !(num == max_exponent / 10 && digit <= max_exponent % 10)) {
        num = max_exponent;
      } else {
        num = num * 10 + digit;
      }
      ++current;
    } while (current != end && *current >= '0' && *current <= '9');

    exponent += (exponen_sign == '-' ? -num : num);
  }

  if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
    return junk_string_value_;
  }
  if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
    return junk_string_value_;
  }
  if (allow_trailing_spaces) {
    AdvanceToNonspace(&current, end);
  }

  parsing_done:
  exponent += insignificant_digits;

  if (octal) {
    double result;
    bool result_is_junk;
    char* start = buffer;
    result = RadixStringToIeee<3>(&start,
                                  buffer + buffer_pos,
                                  sign,
                                  allow_trailing_junk,
                                  junk_string_value_,
                                  read_as_double,
                                  &result_is_junk);
    ASSERT(!result_is_junk);
    *processed_characters_count = static_cast<int>(current - input);
    return result;
  }

  if (nonzero_digit_dropped) {
    buffer[buffer_pos++] = '1';
    exponent--;
  }

  ASSERT(buffer_pos < kBufferSize);
  buffer[buffer_pos] = '\0';

  double converted;
  if (read_as_double) {
    converted = Strtod(Vector<const char>(buffer, buffer_pos), exponent);
  } else {
    converted = Strtof(Vector<const char>(buffer, buffer_pos), exponent);
  }
  *processed_characters_count = static_cast<int>(current - input);
  return sign? -converted: converted;
}